

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::ViewportArray::ViewportAPI::iterate(ViewportAPI *this)

{
  float *pfVar1;
  float *pfVar2;
  pointer pfVar3;
  float fVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *description;
  GLint i;
  uint uVar14;
  ulong uVar15;
  bool test_result;
  GLint max_viewports;
  vector<float,_std::allocator<float>_> scissor_box_data_b;
  vector<float,_std::allocator<float>_> scissor_box_data_a;
  long lVar10;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar8 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar10 = CONCAT44(extraout_var,iVar8);
    test_result = true;
    max_viewports = 0;
    (**(code **)(lVar10 + 0x868))(0x825b,&max_viewports);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x6cb);
    scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              (&scissor_box_data_a,(ulong)(uint)(max_viewports << 2));
    std::vector<float,_std::allocator<float>_>::resize
              (&scissor_box_data_b,(ulong)(uint)(max_viewports << 2));
    getViewports(this,max_viewports,&scissor_box_data_a);
    uVar11 = 0;
    uVar13 = 0;
    if (0 < max_viewports) {
      uVar13 = (ulong)(uint)max_viewports;
    }
    for (; uVar13 * 4 != uVar11; uVar11 = uVar11 + 4) {
      pfVar1 = scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar11 & 0xffffffff);
      fVar4 = pfVar1[1];
      fVar6 = pfVar1[2];
      fVar7 = pfVar1[3];
      pfVar2 = scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar11 & 0xffffffff);
      *pfVar2 = *pfVar1 + 0.125;
      pfVar2[1] = fVar4 + 0.125;
      pfVar2[2] = fVar6 + -0.125;
      pfVar2[3] = fVar7 + -0.125;
    }
    (**(code **)(lVar10 + 0x1a08))
              (0,max_viewports,
               scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"viewportArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x6e4);
    getViewports(this,max_viewports,&scissor_box_data_b);
    compareViewports(this,&scissor_box_data_a,&scissor_box_data_b,"viewportArrayv",&test_result);
    uVar14 = 0;
    for (uVar11 = 0; uVar13 = (ulong)max_viewports, (long)uVar11 < (long)uVar13; uVar11 = uVar11 + 1
        ) {
      pfVar3 = scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      pfVar3[0] = 0.25;
      pfVar3[1] = 0.25;
      pfVar3[2] = 0.75;
      pfVar3[3] = 0.75;
      (**(code **)(lVar10 + 0x1a10))
                (0x3e800000,0x3e800000,0x3f400000,0x3f400000,uVar11 & 0xffffffff);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"viewportIndexedf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x6f6);
      getViewports(this,max_viewports,&scissor_box_data_a);
      compareViewports(this,&scissor_box_data_a,&scissor_box_data_b,"viewportIndexedf",&test_result)
      ;
      uVar14 = uVar14 + 4;
    }
    uVar14 = 0;
    for (uVar11 = 0; (long)uVar11 < (long)(int)uVar13; uVar11 = uVar11 + 1) {
      pfVar3 = scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      *pfVar3 = 0.375;
      pfVar3[1] = 0.375;
      pfVar3[2] = 0.625;
      pfVar3[3] = 0.625;
      (**(code **)(lVar10 + 0x1a18))(uVar11 & 0xffffffff);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"viewportIndexedfv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x709);
      getViewports(this,max_viewports,&scissor_box_data_b);
      compareViewports(this,&scissor_box_data_a,&scissor_box_data_b,"viewportIndexedfv",&test_result
                      );
      uVar13 = (ulong)(uint)max_viewports;
      uVar14 = uVar14 + 4;
    }
    uVar11 = 7;
    uVar13 = 0;
    uVar15 = 0;
    while( true ) {
      if ((long)max_viewports <= (long)uVar15) break;
      fVar4 = *(float *)(&DAT_017d5b78 + (ulong)((uVar15 & 1) == 0) * 4);
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 4) {
        pfVar3 = scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar12 & 0xffffffff);
        *pfVar3 = fVar4;
        pfVar3[1] = fVar4;
        pfVar3[2] = fVar4;
        pfVar3[3] = fVar4;
      }
      uVar15 = uVar15 + 1;
      iVar8 = (int)uVar11;
      for (uVar12 = uVar15 & 0xffffffff; (int)uVar12 < max_viewports;
          uVar12 = (ulong)((int)uVar12 + 1)) {
        iVar5 = (int)uVar11;
        scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5 - 3] = fVar4;
        scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5 - 2] = fVar4;
        scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5 - 1] = fVar4;
        scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = fVar4;
        uVar11 = (ulong)(iVar5 + 4);
      }
      (**(code **)(lVar10 + 0x1a08))
                (0,(long)max_viewports,
                 scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"viewportArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x729);
      getViewports(this,max_viewports,&scissor_box_data_a);
      uVar13 = uVar13 + 4;
      uVar11 = (ulong)(iVar8 + 4);
      compareViewports(this,&scissor_box_data_a,&scissor_box_data_b,"viewportArrayv",&test_result);
    }
    uVar11 = 0;
    uVar13 = 0;
    if (0 < max_viewports) {
      uVar13 = (ulong)(uint)max_viewports;
    }
    for (; uVar13 * 4 != uVar11; uVar11 = uVar11 + 4) {
      pfVar3 = scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar11 & 0xffffffff);
      *pfVar3 = 0.0;
      pfVar3[1] = 0.0;
      pfVar3[2] = 1.0;
      pfVar3[3] = 1.0;
    }
    (**(code **)(lVar10 + 0x1a00))(0,0,1);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x73c);
    getViewports(this,max_viewports,&scissor_box_data_b);
    compareViewports(this,&scissor_box_data_a,&scissor_box_data_b,"viewport",&test_result);
    description = "Fail";
    if (test_result != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,test_result ^ QP_TEST_RESULT_FAIL,
               description);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&scissor_box_data_b.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&scissor_box_data_a.super__Vector_base<float,_std::allocator<float>_>);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x6bf);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ViewportAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLfloat> scissor_box_data_a;
	std::vector<GLfloat> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of VIEWPORT for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ViewportArrayv;
	 *   - get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	getViewports(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 0.125f;
		scissor_box_data_a[i * m_n_elements + 1] += 0.125f;
		scissor_box_data_a[i * m_n_elements + 2] -= 0.125f;
		scissor_box_data_a[i * m_n_elements + 3] -= 0.125f;
	}

	gl.viewportArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewportArrayv");

	getViewports(max_viewports, scissor_box_data_b);
	compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ViewportIndexedf,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 0.25f;
		scissor_box_data_b[i * m_n_elements + 1] = 0.25f;
		scissor_box_data_b[i * m_n_elements + 2] = 0.75f;
		scissor_box_data_b[i * m_n_elements + 3] = 0.75f;

		gl.viewportIndexedf(i, 0.25f, 0.25f, 0.75f, 0.75f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportIndexedf");

		getViewports(max_viewports, scissor_box_data_a);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportIndexedf", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ViewportIndexedfv,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0.375f;
		scissor_box_data_a[i * m_n_elements + 1] = 0.375f;
		scissor_box_data_a[i * m_n_elements + 2] = 0.625f;
		scissor_box_data_a[i * m_n_elements + 3] = 0.625f;

		gl.viewportIndexedfv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportIndexedfv");

		getViewports(max_viewports, scissor_box_data_b);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportIndexedfv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ViewportArrayv,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLfloat value = (0 == i % 2) ? 1.0f : 0.25f;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.viewportArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportArrayv");

		getViewports(max_viewports, scissor_box_data_a);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Viewport;
	 *   - get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0.0f;
		scissor_box_data_a[i * m_n_elements + 1] = 0.0f;
		scissor_box_data_a[i * m_n_elements + 2] = 1.0f;
		scissor_box_data_a[i * m_n_elements + 3] = 1.0f;
	}

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewport");

	getViewports(max_viewports, scissor_box_data_b);
	compareViewports(scissor_box_data_a, scissor_box_data_b, "viewport", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}